

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenubar.cpp
# Opt level: O0

void __thiscall QDBusMenuBar::~QDBusMenuBar(QDBusMenuBar *this)

{
  undefined8 *in_RDI;
  QDBusMenuBar *in_stack_00000030;
  QHash<unsigned_long_long,_QDBusPlatformMenuItem_*> *this_00;
  QHash<unsigned_long_long,_QDBusPlatformMenuItem_*> *c;
  
  *in_RDI = &PTR_metaObject_00e25858;
  unregisterMenuBar(in_stack_00000030);
  c = (QHash<unsigned_long_long,_QDBusPlatformMenuItem_*> *)in_RDI[3];
  if (c != (QHash<unsigned_long_long,_QDBusPlatformMenuItem_*> *)0x0) {
    (*(code *)c->d->spans)();
  }
  this_00 = (QHash<unsigned_long_long,_QDBusPlatformMenuItem_*> *)in_RDI[2];
  if (this_00 != (QHash<unsigned_long_long,_QDBusPlatformMenuItem_*> *)0x0) {
    (*(code *)this_00->d->spans)();
  }
  qDeleteAll<QHash<unsigned_long_long,QDBusPlatformMenuItem*>>(c);
  QString::~QString((QString *)0xaed794);
  QPointer<QWindow>::~QPointer((QPointer<QWindow> *)0xaed7a2);
  QHash<unsigned_long_long,_QDBusPlatformMenuItem_*>::~QHash(this_00);
  QPlatformMenuBar::~QPlatformMenuBar((QPlatformMenuBar *)0xaed7ba);
  return;
}

Assistant:

QDBusMenuBar::~QDBusMenuBar()
{
    unregisterMenuBar();
    delete m_menuAdaptor;
    delete m_menu;
    qDeleteAll(m_menuItems);
}